

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warped_motion.c
# Opt level: O0

int32_t get_mult_shift_diag(int64_t Px,int16_t iDet,int shift)

{
  long lVar1;
  int64_t iVar2;
  byte in_DL;
  short in_SI;
  long in_RDI;
  int64_t v;
  undefined8 local_20;
  
  lVar1 = in_RDI * in_SI;
  if (lVar1 < 0) {
    local_20 = -(((1L << (in_DL & 0x3f)) >> 1) - lVar1 >> (in_DL & 0x3f));
  }
  else {
    local_20 = lVar1 + ((1L << (in_DL & 0x3f)) >> 1) >> (in_DL & 0x3f);
  }
  iVar2 = clamp64(local_20,0xe001,0x11fff);
  return (int32_t)iVar2;
}

Assistant:

static int32_t get_mult_shift_diag(int64_t Px, int16_t iDet, int shift) {
  int64_t v = Px * (int64_t)iDet;
  return (int32_t)clamp64(
      ROUND_POWER_OF_TWO_SIGNED_64(v, shift),
      (1 << WARPEDMODEL_PREC_BITS) - WARPEDMODEL_NONDIAGAFFINE_CLAMP + 1,
      (1 << WARPEDMODEL_PREC_BITS) + WARPEDMODEL_NONDIAGAFFINE_CLAMP - 1);
}